

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

int SSL_CTX_set_alpn_protos(SSL_CTX *ctx,uint8_t *protos,size_t protos_len)

{
  bool bVar1;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  
  if ((protos_len != 0) &&
     (in.size_ = protos_len, in.data_ = (uchar *)protos_len,
     bVar1 = bssl::ssl_is_valid_alpn_list((bssl *)protos,in), !bVar1)) {
    ERR_put_error(0x10,0,0x13b,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                  ,0x8a5);
    return 1;
  }
  in_00.size_ = protos_len;
  in_00.data_ = protos;
  bVar1 = bssl::Array<unsigned_char>::CopyFrom(&ctx->alpn_client_proto_list,in_00);
  return (uint)!bVar1;
}

Assistant:

int SSL_CTX_set_alpn_protos(SSL_CTX *ctx, const uint8_t *protos,
                            size_t protos_len) {
  // Note this function's return value is backwards.
  auto span = Span(protos, protos_len);
  if (!span.empty() && !ssl_is_valid_alpn_list(span)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_ALPN_PROTOCOL_LIST);
    return 1;
  }
  return ctx->alpn_client_proto_list.CopyFrom(span) ? 0 : 1;
}